

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O1

ngx_int_t ngx_http_variable_binary_remote_addr
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  sockaddr *psVar1;
  char *pcVar2;
  
  psVar1 = r->connection->sockaddr;
  if (psVar1->sa_family == 1) {
    *(uint *)v = ((uint)(r->connection->addr_text).len & 0xfffffff) + (*(uint *)v & 0x80000000) +
                 0x10000000;
    pcVar2 = (char *)(r->connection->addr_text).data;
  }
  else if (psVar1->sa_family == 10) {
    *(uint *)v = *(uint *)v & 0x80000000 | 0x10000010;
    pcVar2 = psVar1->sa_data + 6;
  }
  else {
    *(uint *)v = *(uint *)v & 0x80000000 | 0x10000004;
    pcVar2 = psVar1->sa_data + 2;
  }
  v->data = (u_char *)pcVar2;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_binary_remote_addr(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    struct sockaddr_in   *sin;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6  *sin6;
#endif

    switch (r->connection->sockaddr->sa_family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) r->connection->sockaddr;

        v->len = sizeof(struct in6_addr);
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = sin6->sin6_addr.s6_addr;

        break;
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:

        v->len = r->connection->addr_text.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = r->connection->addr_text.data;

        break;
#endif

    default: /* AF_INET */
        sin = (struct sockaddr_in *) r->connection->sockaddr;

        v->len = sizeof(in_addr_t);
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = (u_char *) &sin->sin_addr;

        break;
    }

    return NGX_OK;
}